

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O0

bool __thiscall
bssl::TemporaryDirectory::AddFile
          (TemporaryDirectory *this,string *filename,Span<const_unsigned_char> content)

{
  bool bVar1;
  ulong uVar2;
  char *__filename;
  FILE *pFVar3;
  uchar *__ptr;
  size_t __size;
  size_t sVar4;
  string local_58;
  unique_ptr<_IO_FILE,_bssl::FileDeleter> local_38;
  ScopedFILE file;
  string *filename_local;
  TemporaryDirectory *this_local;
  Span<const_unsigned_char> content_local;
  
  content_local.data_ = (uchar *)content.size_;
  this_local = (TemporaryDirectory *)content.data_;
  file._M_t.super___uniq_ptr_impl<_IO_FILE,_bssl::FileDeleter>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_bssl::FileDeleter>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_IO_FILE,_bssl::FileDeleter,_true,_true>)
                 (__uniq_ptr_data<_IO_FILE,_bssl::FileDeleter,_true,_true>)filename;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    content_local.size_._7_1_ = 0;
    goto LAB_0067d1e9;
  }
  GetFilePath(&local_58,this,
              (string *)
              file._M_t.super___uniq_ptr_impl<_IO_FILE,_bssl::FileDeleter>._M_t.
              super__Tuple_impl<0UL,__IO_FILE_*,_bssl::FileDeleter>.
              super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar3 = fopen(__filename,"wb");
  std::unique_ptr<_IO_FILE,bssl::FileDeleter>::unique_ptr<bssl::FileDeleter,void>
            ((unique_ptr<_IO_FILE,bssl::FileDeleter> *)&local_38,(pointer)pFVar3);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = std::operator==(&local_38,(nullptr_t)0x0);
  if (bVar1) {
    perror("Could not open temporary file");
    content_local.size_._7_1_ = 0;
  }
  else {
    bVar1 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&this_local);
    if (!bVar1) {
      __ptr = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&this_local);
      __size = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&this_local);
      pFVar3 = (FILE *)std::unique_ptr<_IO_FILE,_bssl::FileDeleter>::get(&local_38);
      sVar4 = fwrite(__ptr,__size,1,pFVar3);
      if (sVar4 != 1) {
        perror("Could not write temporary file");
        content_local.size_._7_1_ = 0;
        goto LAB_0067d1e0;
      }
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->files_,
             (value_type *)
             file._M_t.super___uniq_ptr_impl<_IO_FILE,_bssl::FileDeleter>._M_t.
             super__Tuple_impl<0UL,__IO_FILE_*,_bssl::FileDeleter>.
             super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
    content_local.size_._7_1_ = 1;
  }
LAB_0067d1e0:
  std::unique_ptr<_IO_FILE,_bssl::FileDeleter>::~unique_ptr(&local_38);
LAB_0067d1e9:
  return (bool)(content_local.size_._7_1_ & 1);
}

Assistant:

bool TemporaryDirectory::AddFile(const std::string &filename,
                                 bssl::Span<const uint8_t> content) {
  if (path_.empty()) {
    return false;
  }

  ScopedFILE file(fopen(GetFilePath(filename).c_str(), "wb"));
  if (file == nullptr) {
    perror("Could not open temporary file");
    return false;
  }
  if (!content.empty() &&
      fwrite(content.data(), content.size(), /*nitems=*/1, file.get()) != 1) {
    perror("Could not write temporary file");
    return false;
  }

  files_.insert(filename);
  return true;
}